

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall QWidgetTextControl::print(QWidgetTextControl *this,QPagedPaintDevice *printer)

{
  QWidgetTextControlPrivate *pQVar1;
  QPagedPaintDevicePrivate *pQVar2;
  ulong uVar3;
  QPagedPaintDevice *in_RSI;
  long in_FS_OFFSET;
  QTextDocument *doc;
  QTextDocument *tempDoc;
  QWidgetTextControlPrivate *d;
  QSizeF *pQVar4;
  QSizeF *this_00;
  QSizeF *local_98;
  QSizeF *local_90;
  QTextDocumentFragment local_70 [8];
  QTextCursor local_68 [8];
  undefined8 local_60;
  undefined1 local_50 [56];
  QFont local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QWidgetTextControl *)0x71ddf0);
  if (in_RSI != (QPagedPaintDevice *)0x0) {
    local_90 = (QSizeF *)0x0;
    pQVar4 = (QSizeF *)pQVar1->doc;
    pQVar2 = QPagedPaintDevicePrivate::get(in_RSI);
    local_98 = pQVar4;
    if (((byte)pQVar2[0x11] & 1) != 0) {
      uVar3 = QTextCursor::hasSelection();
      if ((uVar3 & 1) == 0) goto LAB_0071e034;
      local_98 = (QSizeF *)operator_new(0x10);
      QTextDocument::QTextDocument((QTextDocument *)local_98,(QObject *)pQVar4);
      pQVar4 = local_98;
      QTextDocument::resourceProvider();
      QTextDocument::setResourceProvider((function *)pQVar4);
      std::function<QVariant_(const_QUrl_&)>::~function
                ((function<QVariant_(const_QUrl_&)> *)0x71dea8);
      this_00 = local_98;
      QTextDocument::metaInformation((MetaInformation)local_50);
      QTextDocument::setMetaInformation((MetaInformation)this_00,(QString *)0x0);
      QString::~QString((QString *)0x71dee7);
      local_60 = QTextDocument::pageSize();
      QTextDocument::setPageSize(local_98);
      QTextDocument::defaultFont();
      QTextDocument::setDefaultFont((QFont *)local_98);
      QFont::~QFont(local_18);
      QTextDocument::useDesignMetrics();
      QTextDocument::setUseDesignMetrics(SUB81(local_98,0));
      QTextCursor::QTextCursor(local_68,(QTextDocument *)local_98);
      QTextCursor::selection();
      QTextCursor::insertFragment((QTextDocumentFragment *)local_68);
      QTextDocumentFragment::~QTextDocumentFragment(local_70);
      QTextCursor::~QTextCursor(local_68);
      QTextDocument::documentLayout();
      QAbstractTextDocumentLayout::d_func((QAbstractTextDocumentLayout *)0x71dfe0);
      QTextDocument::documentLayout();
      QAbstractTextDocumentLayout::d_func((QAbstractTextDocumentLayout *)0x71dffb);
      QHash<int,_QTextObjectHandler>::operator=
                ((QHash<int,_QTextObjectHandler> *)this_00,(QHash<int,_QTextObjectHandler> *)pQVar4)
      ;
      local_90 = local_98;
    }
    QTextDocument::print((QPagedPaintDevice *)local_98);
    if (local_90 != (QSizeF *)0x0) {
      (**(code **)((long)local_90->wd + 0x20))();
    }
  }
LAB_0071e034:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControl::print(QPagedPaintDevice *printer) const
{
    Q_D(const QWidgetTextControl);
    if (!printer)
        return;
    QTextDocument *tempDoc = nullptr;
    const QTextDocument *doc = d->doc;
    if (QPagedPaintDevicePrivate::get(printer)->printSelectionOnly) {
        if (!d->cursor.hasSelection())
            return;
        tempDoc = new QTextDocument(const_cast<QTextDocument *>(doc));
        tempDoc->setResourceProvider(doc->resourceProvider());
        tempDoc->setMetaInformation(QTextDocument::DocumentTitle, doc->metaInformation(QTextDocument::DocumentTitle));
        tempDoc->setPageSize(doc->pageSize());
        tempDoc->setDefaultFont(doc->defaultFont());
        tempDoc->setUseDesignMetrics(doc->useDesignMetrics());
        QTextCursor(tempDoc).insertFragment(d->cursor.selection());
        doc = tempDoc;

        // copy the custom object handlers
        doc->documentLayout()->d_func()->handlers = d->doc->documentLayout()->d_func()->handlers;
    }
    doc->print(printer);
    delete tempDoc;
}